

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_joystick_events.c
# Opt level: O1

int main(int argc,char **argv)

{
  float fVar1;
  undefined4 uVar2;
  _Bool _Var3;
  ALLEGRO_FONT *pAVar4;
  ALLEGRO_EVENT_QUEUE *pAVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  ALLEGRO_JOYSTICK *pAVar14;
  ALLEGRO_COLOR *pAVar15;
  char *pcVar16;
  size_t sVar17;
  int iVar18;
  long unaff_RBX;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  int *piVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined8 in_XMM1_Qa;
  double dVar27;
  double dVar28;
  float fVar29;
  double dVar30;
  double dVar31;
  float fVar32;
  float fVar33;
  ALLEGRO_EVENT event;
  undefined1 auStack_260 [192];
  int aiStack_1a0 [32];
  long lStack_120;
  undefined4 local_b8;
  int local_78 [8];
  int local_58;
  int local_54;
  float local_50;
  int local_4c;
  
  cVar6 = al_install_system(0x5020700,atexit);
  if (cVar6 == '\0') {
    pcVar16 = "Could not init Allegro.\n";
  }
  else {
    al_init_primitives_addon();
    al_init_font_addon();
    lVar11 = al_create_display(0x400,0x300);
    if (lVar11 == 0) {
      pcVar16 = "al_create_display failed\n";
    }
    else {
      al_install_keyboard();
      uVar13 = al_map_rgb(0,0,0);
      black.b = (float)(int)in_XMM1_Qa;
      black.r = (float)(int)uVar13;
      black.g = (float)(int)((ulong)uVar13 >> 0x20);
      black.a = (float)((ulong)in_XMM1_Qa >> 0x20);
      uVar13 = al_map_rgb(0xe0,0xe0,0xe0);
      grey.b = (float)(int)in_XMM1_Qa;
      grey.r = (float)(int)uVar13;
      grey.g = (float)(int)((ulong)uVar13 >> 0x20);
      grey.a = (float)((ulong)in_XMM1_Qa >> 0x20);
      uVar13 = al_map_rgb(0xff,0xff,0xff);
      white.b = (float)(int)in_XMM1_Qa;
      white.r = (float)(int)uVar13;
      white.g = (float)(int)((ulong)uVar13 >> 0x20);
      white.a = (float)((ulong)in_XMM1_Qa >> 0x20);
      font = (ALLEGRO_FONT *)al_create_builtin_font();
      al_install_joystick();
      event_queue = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
      if (event_queue != (ALLEGRO_EVENT_QUEUE *)0x0) {
        lVar12 = al_get_keyboard_event_source();
        pAVar5 = event_queue;
        if (lVar12 != 0) {
          uVar13 = al_get_keyboard_event_source();
          al_register_event_source(pAVar5,uVar13);
        }
        pAVar5 = event_queue;
        uVar13 = al_get_display_event_source(lVar11);
        al_register_event_source(pAVar5,uVar13);
        pAVar5 = event_queue;
        uVar13 = al_get_joystick_event_source();
        al_register_event_source(pAVar5,uVar13);
        pAVar14 = (ALLEGRO_JOYSTICK *)al_get_joystick(0);
        setup_joystick_values(pAVar14);
        do {
          cVar6 = al_is_event_queue_empty(event_queue);
          if (cVar6 != '\0') {
            lVar11 = al_get_joystick(0);
            uVar13 = al_get_target_bitmap();
            iVar7 = al_get_bitmap_width(uVar13);
            iVar8 = al_get_bitmap_height(uVar13);
            al_map_rgb(0xff,0xff,0xc0);
            al_clear_to_color();
            pAVar4 = font;
            if (lVar11 != 0) {
              uVar13 = al_get_joystick_name(lVar11);
              al_draw_textf(black.r,black._8_8_,(float)(iVar7 / 2),0x41200000,pAVar4,1,
                            "Joystick: %s",uVar13);
            }
            if (0 < num_sticks) {
              uVar21 = 0;
              do {
                dVar28 = ((double)((uint)uVar21 & 3) + 0.5) * (double)iVar7 * 0.25;
                iVar18 = (int)dVar28;
                dVar27 = (((double)((uint)(uVar21 >> 2) & 0x3fffffff) + 0.5) * (double)iVar8) / 6.0;
                iVar19 = (int)dVar27;
                fVar32 = (float)(int)dVar28;
                iVar20 = (int)(joys[uVar21][0] * 30.0 + fVar32);
                fVar24 = (float)(int)dVar27;
                fVar26 = (float)(iVar19 + -0x23);
                fVar1 = joys[uVar21][2];
                fVar33 = (float)(iVar19 + 0x23);
                iVar22 = (int)(joys[uVar21][1] * 30.0 + fVar24);
                al_draw_filled_rectangle
                          ((float)(iVar18 + -0x23),fVar26,(float)(iVar18 + 0x23),fVar33,grey._0_8_,
                           grey._8_8_);
                dVar28 = (double)(iVar19 + -0x23) + 0.5;
                dVar27 = (double)(iVar18 + 0x23) + -0.5;
                al_draw_rectangle((float)(iVar18 + -0x23) + 0.5,
                                  CONCAT44((int)((ulong)dVar28 >> 0x20),(float)dVar28),
                                  CONCAT44((int)((ulong)dVar27 >> 0x20),(float)dVar27),
                                  (float)(iVar19 + 0x23) + -0.5,black._0_8_,black._8_8_,0);
                al_draw_filled_rectangle
                          ((float)(iVar20 + -5),(float)(iVar22 + -5),(float)(iVar20 + 5),
                           (float)(iVar22 + 5),black._0_8_,black._8_8_);
                if (2 < num_axes[uVar21]) {
                  fVar25 = (float)(iVar18 + 0x28);
                  fVar29 = (float)(iVar18 + 0x32);
                  iVar18 = (int)(fVar1 * 30.0 + fVar24);
                  al_draw_filled_rectangle(fVar25,fVar26,fVar29,fVar33,grey._0_8_,grey._8_8_);
                  al_draw_rectangle(fVar25 + 0.5,fVar26 + 0.5,fVar29 + -0.5,fVar33 + -0.5,
                                    black._0_8_,black._8_8_,0);
                  al_draw_filled_rectangle
                            (fVar25,(float)(iVar18 + -5),fVar29,(float)(iVar18 + 5),black._0_8_,
                             black._8_8_);
                }
                pAVar4 = font;
                if (lVar11 != 0) {
                  uVar13 = al_get_joystick_stick_name(lVar11,uVar21 & 0xffffffff);
                  al_draw_text(black.r,black._8_8_,fVar32,(float)(iVar19 + 0x24),pAVar4,1,uVar13);
                  if (0 < num_axes[uVar21]) {
                    iVar19 = iVar19 + 0x2d;
                    iVar18 = 0;
                    do {
                      pAVar4 = font;
                      iVar18 = iVar18 + 1;
                      uVar13 = al_get_joystick_axis_name(lVar11,uVar21 & 0xffffffff);
                      al_draw_text(black.r,black._8_8_,fVar32,(float)iVar19,pAVar4,1,uVar13);
                      iVar19 = iVar19 + 10;
                    } while (iVar18 < num_axes[uVar21]);
                  }
                }
                uVar21 = uVar21 + 1;
              } while ((long)uVar21 < (long)num_sticks);
            }
            if (0 < num_buttons) {
              uVar21 = 0;
              do {
                _Var3 = joys_buttons[uVar21];
                uVar13 = al_get_target_bitmap();
                iVar19 = al_get_bitmap_width(uVar13);
                iVar8 = ((uint)uVar21 & 7) * 0x1e;
                iVar7 = iVar8 + iVar19 / 2;
                iVar20 = al_get_bitmap_height(uVar13);
                iVar18 = ((uint)(uVar21 >> 3) & 0x1fffffff) * 0x1e;
                iVar22 = iVar18 + iVar20;
                al_draw_filled_rectangle
                          ((float)(iVar7 + -0x78),(float)(iVar22 + -0x78),
                           (float)(iVar8 + -0x5f + iVar19 / 2),(float)(iVar18 + -0x5f + iVar20),
                           grey._0_8_,grey._8_8_);
                dVar30 = (double)(iVar7 + -0x78);
                dVar28 = (double)(iVar22 + -0x78);
                dVar27 = dVar28 + 0.5;
                dVar31 = dVar30 + 24.5;
                al_draw_rectangle((float)(dVar30 + 0.5),
                                  CONCAT44((int)((ulong)dVar27 >> 0x20),(float)dVar27),
                                  CONCAT44((int)((ulong)dVar31 >> 0x20),(float)dVar31),
                                  (float)(dVar28 + 24.5),black._0_8_,black._8_8_,0);
                pAVar15 = &black;
                if (_Var3 == true) {
                  al_draw_filled_rectangle
                            ((float)(iVar7 + -0x76),(float)(iVar22 + -0x76),(float)(iVar7 + -0x61),
                             (float)(iVar22 + -0x61),black._0_8_,black._8_8_);
                  pAVar15 = &white;
                }
                if (lVar11 != 0) {
                  uVar2 = pAVar15->r;
                  uVar13._0_4_ = pAVar15->b;
                  uVar13._4_4_ = pAVar15->a;
                  pcVar16 = (char *)al_get_joystick_button_name(lVar11,uVar21 & 0xffffffff);
                  sVar17 = strlen(pcVar16);
                  if (sVar17 < 4) {
                    al_draw_text(uVar2,uVar13,(float)(iVar7 + -0x6b),(float)(iVar22 + -0x70),font,1,
                                 pcVar16);
                  }
                }
                uVar21 = uVar21 + 1;
              } while ((long)uVar21 < (long)num_buttons);
            }
            al_flip_display();
          }
          al_wait_for_event(event_queue,local_78);
          switch(local_78[0]) {
          case 1:
            if (local_54 < 3 && (long)local_58 < 0x10) {
              joys[local_58][local_54] = local_50;
            }
            break;
          case 2:
            joys_buttons[local_4c] = true;
            break;
          case 3:
            joys_buttons[local_4c] = false;
            break;
          case 4:
            al_reconfigure_joysticks();
            pAVar14 = (ALLEGRO_JOYSTICK *)al_get_joystick(0);
            setup_joystick_values(pAVar14);
            break;
          case 5:
          case 6:
          case 7:
          case 8:
          case 9:
            break;
          case 10:
            if (local_58 == 0x3b) goto LAB_00102d3c;
            break;
          default:
            if (local_78[0] == 0x2a) {
LAB_00102d3c:
              al_destroy_font(font);
              return 0;
            }
          }
        } while( true );
      }
      pcVar16 = "al_create_event_queue failed\n";
      event_queue = (ALLEGRO_EVENT_QUEUE *)0x0;
      unaff_RBX = lVar11;
    }
  }
  abort_example(pcVar16);
  if (pcVar16 == (char *)0x0) {
    num_sticks = 0;
    num_buttons = 0;
    return 0;
  }
  lStack_120 = unaff_RBX;
  al_get_joystick_state();
  iVar7 = al_get_joystick_num_sticks(pcVar16);
  num_sticks = 0x10;
  if (iVar7 < 0x10) {
    num_sticks = iVar7;
  }
  if (0 < iVar7) {
    piVar23 = num_axes;
    lVar11 = 0;
    uVar21 = 0;
    do {
      uVar9 = al_get_joystick_num_axes(pcVar16,uVar21 & 0xffffffff);
      *piVar23 = uVar9;
      if (0 < (int)uVar9) {
        memcpy((void *)((long)joys[0] + lVar11),auStack_260 + lVar11,(ulong)uVar9 << 2);
      }
      uVar21 = uVar21 + 1;
      piVar23 = (int *)((uint *)piVar23 + 1);
      lVar11 = lVar11 + 0xc;
    } while ((long)uVar21 < (long)num_sticks);
  }
  uVar10 = al_get_joystick_num_buttons(pcVar16);
  uVar9 = 0x20;
  if ((int)uVar10 < 0x20) {
    uVar9 = uVar10;
  }
  num_buttons = uVar9;
  if (0 < (int)uVar10) {
    uVar21 = 0;
    do {
      joys_buttons[uVar21] = 0x3fff < aiStack_1a0[uVar21];
      uVar21 = uVar21 + 1;
      uVar10 = uVar9;
    } while (uVar9 != uVar21);
  }
  return uVar10;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_primitives_addon();
   al_init_font_addon();

   display = al_create_display(1024, 768);
   if (!display) {
      abort_example("al_create_display failed\n");
   }

   al_install_keyboard();

   black = al_map_rgb(0, 0, 0);
   grey = al_map_rgb(0xe0, 0xe0, 0xe0);
   white = al_map_rgb(255, 255, 255);
   font = al_create_builtin_font();

   al_install_joystick();

   event_queue = al_create_event_queue();
   if (!event_queue) {
      abort_example("al_create_event_queue failed\n");
   }

   if (al_get_keyboard_event_source()) {
      al_register_event_source(event_queue, al_get_keyboard_event_source());
   }
   al_register_event_source(event_queue, al_get_display_event_source(display));
   al_register_event_source(event_queue, al_get_joystick_event_source());

   setup_joystick_values(al_get_joystick(0));

   main_loop();

   al_destroy_font(font);

   return 0;
}